

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang_bis.c
# Opt level: O2

void yyerror(YYLTYPE *yylloc,void *scanner,yang_parameter *param,...)

{
  char *pcVar1;
  void *elem;
  LY_VLOG_ELEM elem_type;
  ly_ctx *ctx;
  
  free(*param->value);
  *param->value = (char *)0x0;
  if (yylloc->first_line != -1) {
    elem = *param->data_node;
    if ((elem == (void *)0x0) || (elem != *param->actual_node)) {
      ctx = param->module->ctx;
      pcVar1 = yyget_text(scanner);
      elem_type = LY_VLOG_NONE;
      elem = (void *)0x0;
    }
    else {
      ctx = param->module->ctx;
      pcVar1 = yyget_text(scanner);
      elem_type = LY_VLOG_LYS;
    }
    ly_vlog(ctx,LYE_INSTMT,elem_type,elem,pcVar1);
    return;
  }
  return;
}

Assistant:

void
yyerror(YYLTYPE *yylloc, void *scanner, struct yang_parameter *param, ...)
{
  free(*param->value);
  *param->value = NULL;
  if (yylloc->first_line != -1) {
    if (*param->data_node && (*param->data_node) == (*param->actual_node)) {
      LOGVAL(param->module->ctx, LYE_INSTMT, LY_VLOG_LYS, *param->data_node, yyget_text(scanner));
    } else {
      LOGVAL(param->module->ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, yyget_text(scanner));
    }
  }
}